

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.hpp
# Opt level: O0

void __thiscall
boost::unit_test::framework::internal_error::internal_error(internal_error *this,const_string *m)

{
  iterator pvVar1;
  size_type sVar2;
  basic_cstring<const_char> *in_RSI;
  runtime_error *in_RDI;
  allocator local_31;
  string local_30 [48];
  
  pvVar1 = basic_cstring<const_char>::begin(in_RSI);
  sVar2 = basic_cstring<const_char>::size(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pvVar1,sVar2,&local_31);
  std::runtime_error::runtime_error(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *(undefined ***)in_RDI = &PTR__internal_error_00302790;
  return;
}

Assistant:

struct BOOST_TEST_DECL internal_error : public std::runtime_error {
    internal_error( const_string m ) : std::runtime_error( std::string( m.begin(), m.size() ) ) {}
}